

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O1

BoyerMooreTextFindResult * __thiscall
axl::sl::
BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::find(BoyerMooreTextFindResult *__return_storage_ptr__,
      BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
      *this,void *p,size_t size,utf32_t replacementChar)

{
  wchar_t *pwVar1;
  size_t sVar2;
  BoyerMooreTextState state;
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> local_c8;
  BoyerMooreTextState local_a8;
  
  pwVar1 = (this->
           super_BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
           ).m_pattern.super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_p;
  sVar2 = (this->
          super_BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
          ).m_pattern.super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_count;
  local_c8.m_length._0_1_ = 0;
  local_c8.m_length._1_7_ = 0;
  local_c8.m_isNullTerminated = false;
  local_c8.m_p = (C *)0x0;
  local_c8.m_hdr._0_1_ = 0;
  local_c8.m_hdr._1_7_ = 0;
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::attachBufHdr
            (&local_c8,(BufHdr *)0x0);
  local_c8.m_length._0_1_ = (undefined1)sVar2;
  local_c8.m_length._1_7_ = (undefined7)(sVar2 >> 8);
  local_c8.m_isNullTerminated = false;
  local_c8.m_p = pwVar1;
  BoyerMooreTextState::BoyerMooreTextState(&local_a8,&local_c8);
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::release(&local_c8);
  find(__return_storage_ptr__,this,&local_a8,p,size,replacementChar);
  ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release
            ((ArrayRef<char,_axl::sl::ArrayDetails<char>_> *)&local_a8.m_binTail);
  ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::release
            ((ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *)
             &local_a8.super_BoyerMooreStateBase<wchar_t>.m_tail);
  return __return_storage_ptr__;
}

Assistant:

BoyerMooreTextFindResult
	find(
		const void* p,
		size_t size,
		utf32_t replacementChar = enc::StdChar_Replacement
	) const {
		BoyerMooreTextState state(sl::StringRef_utf32(this->m_pattern, this->m_pattern.getCount()));
		BoyerMooreTextFindResult result = find(&state, p, size, replacementChar);
		if (IsWholeWord && !result.isValid())
			result = eof(&state);
		return result;
	}